

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::
iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>
::operator++(iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::KeyValuePair>
             *this)

{
  void *pvVar1;
  bool bVar2;
  Node *pNVar3;
  LogMessage *other;
  size_type sVar4;
  TreeIterator tree_it;
  LogFinisher local_59;
  TreeIterator local_58;
  LogMessage local_50;
  
  pNVar3 = this->node_->next;
  if (pNVar3 == (Node *)0x0) {
    local_58._M_node = (_Rb_tree_node_base *)0x0;
    bVar2 = revalidate_if_necessary(this,&local_58);
    if (bVar2) {
      sVar4 = this->bucket_index_ + 1;
    }
    else {
      if ((this->bucket_index_ & 1) != 0) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                   ,0x1b2);
        other = internal::LogMessage::operator<<
                          (&local_50,"CHECK failed: (bucket_index_ & 1) == (0): ");
        internal::LogFinisher::operator=(&local_59,other);
        internal::LogMessage::~LogMessage(&local_50);
      }
      sVar4 = this->bucket_index_;
      pvVar1 = this->m_->table_[sVar4];
      local_58._M_node = (_Base_ptr)std::_Rb_tree_increment(local_58._M_node);
      if (local_58._M_node != (_Rb_tree_node_base *)((long)pvVar1 + 0x10)) {
        pNVar3 = *(Node **)(local_58._M_node + 1);
        goto LAB_001c7072;
      }
      sVar4 = sVar4 + 2;
    }
    SearchFrom(this,sVar4);
  }
  else {
LAB_001c7072:
    this->node_ = pNVar3;
  }
  return this;
}

Assistant:

iterator_base& operator++() {
        if (node_->next == NULL) {
          TreeIterator tree_it;
          const bool is_list = revalidate_if_necessary(&tree_it);
          if (is_list) {
            SearchFrom(bucket_index_ + 1);
          } else {
            GOOGLE_DCHECK_EQ(bucket_index_ & 1, 0);
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            if (++tree_it == tree->end()) {
              SearchFrom(bucket_index_ + 2);
            } else {
              node_ = NodePtrFromKeyPtr(*tree_it);
            }
          }
        } else {
          node_ = node_->next;
        }
        return *this;
      }